

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O2

void __thiscall
bssl::(anonymous_namespace)::
ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test::
~ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test
          (ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test *this)

{
  anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test::
  ~ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test
            ((ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test *)
             (this + -0x10));
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest,
       OnePolicyWithCustomQualifier) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_with_custom_qualifier.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  bool result = ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors);

  if (fail_parsing_unknown_qualifier_oids()) {
    EXPECT_FALSE(result);
  } else {
    EXPECT_TRUE(result);
    ASSERT_EQ(1U, policies.size());
    EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
  }
}